

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

FBOCache * __thiscall
Diligent::RenderDeviceGLImpl::GetFBOCache(RenderDeviceGLImpl *this,NativeGLContextType Context)

{
  SpinLock *this_00;
  byte bVar1;
  mapped_type *pmVar2;
  NativeGLContextType local_18;
  
  this_00 = &this->m_FBOCacheLock;
  LOCK();
  bVar1 = (this->m_FBOCacheLock).m_IsLocked._M_base._M_i;
  (this->m_FBOCacheLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  local_18 = Context;
  while ((bVar1 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar1 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  pmVar2 = std::__detail::
           _Map_base<__GLXcontextRec_*,_std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>,_std::__detail::_Select1st,_std::equal_to<__GLXcontextRec_*>,_std::hash<__GLXcontextRec_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<__GLXcontextRec_*,_std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>,_std::__detail::_Select1st,_std::equal_to<__GLXcontextRec_*>,_std::hash<__GLXcontextRec_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_FBOCache,&local_18);
  Threading::SpinLock::unlock(this_00);
  return pmVar2;
}

Assistant:

FBOCache& RenderDeviceGLImpl::GetFBOCache(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard FBOCacheGuard{m_FBOCacheLock};
    return m_FBOCache[Context];
}